

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairedReadsDatastore.cc
# Opt level: O0

string * __thiscall
PairedReadsDatastore::ls_abi_cxx11_(PairedReadsDatastore *this,int level,bool recursive)

{
  ostream *poVar1;
  uint64_t uVar2;
  byte in_CL;
  int in_EDX;
  PairedReadsDatastore *in_RSI;
  PairedReadsMapper *in_RDI;
  string spacer;
  stringstream ss;
  string local_1f8 [55];
  allocator local_1c1;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190;
  byte local_15;
  int local_14;
  PairedReadsMapper *this_00;
  
  local_15 = in_CL & 1;
  local_14 = in_EDX;
  this_00 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,(long)(local_14 * 2),' ',&local_1c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  poVar1 = std::operator<<(&local_190,local_1c0);
  poVar1 = std::operator<<(poVar1,"Paired Reads Datastore ");
  poVar1 = std::operator<<(poVar1,(string *)&in_RSI->name);
  poVar1 = std::operator<<(poVar1,": ");
  uVar2 = size(in_RSI);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1," reads");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((local_15 & 1) != 0) {
    PairedReadsMapper::ls_abi_cxx11_
              (this_00,(int)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    std::operator<<(&local_190,local_1f8);
    std::__cxx11::string::~string(local_1f8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return (string *)in_RDI;
}

Assistant:

std::string PairedReadsDatastore::ls(int level, bool recursive) const {
    std::stringstream ss;
    std::string spacer(2*level,' ');
    ss<<spacer<<"Paired Reads Datastore "<<name<<": "<<size()<<" reads"<<std::endl;
    if (recursive) ss<<mapper.ls(level+1,true);
    return ss.str();
}